

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitfoot.h
# Opt level: O3

uint64_t __thiscall bitfoot::Bitfoot::BishopXO(Bitfoot *this,int sqr)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  if ((uint)sqr < 0x40) {
    uVar7 = (ulong)(uint)sqr;
    uVar3 = this->pc[1] | this->pc[0];
    uVar2 = 0xffffffffffffffff;
    uVar4 = *(ulong *)(_SOUTH_EAST + uVar7 * 8) & uVar3;
    if (uVar4 == 0) {
      uVar4 = 0;
      uVar6 = 0xffffffffffffffff;
    }
    else {
      lVar1 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      uVar4 = *(ulong *)(_BITMAP + (uint)((int)lVar1 << 3));
      uVar6 = -uVar4 ^ uVar4;
    }
    uVar8 = *(ulong *)(_SOUTH_WEST + uVar7 * 8) & uVar3;
    if (uVar8 == 0) {
      uVar8 = 0;
    }
    else {
      lVar1 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      uVar8 = *(ulong *)(_BITMAP + (uint)((int)lVar1 << 3));
      uVar2 = -uVar8 ^ uVar8;
    }
    uVar5 = uVar3 & *(ulong *)(_NORTH_EAST + uVar7 * 8);
    uVar5 = -uVar5 & uVar5;
    uVar3 = uVar3 & *(ulong *)(_NORTH_WEST + uVar7 * 8);
    uVar3 = -uVar3 & uVar3;
    return uVar2 & *(ulong *)(_SOUTH_WEST + uVar7 * 8) |
           uVar4 | uVar6 & *(ulong *)(_SOUTH_EAST + uVar7 * 8) | uVar8 | uVar3 | uVar5 |
           uVar5 - 1 & *(ulong *)(_NORTH_EAST + uVar7 * 8) |
           uVar3 - 1 & *(ulong *)(_NORTH_WEST + uVar7 * 8);
  }
  __assert_fail("IS_SQUARE(sqr)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                ,0x243,"uint64_t bitfoot::Bitfoot::BishopXO(const int) const");
}

Assistant:

inline uint64_t BishopXO(const int sqr) const {
    assert(IS_SQUARE(sqr));
    return (NorthEastXO(sqr) | NorthWestXO(sqr) |
            SouthEastXO(sqr) | SouthWestXO(sqr));
  }